

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O0

void hta::storage::file::check_hta
               (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *file,Duration interval
               ,TimePoint raw_epoch,TimePoint raw_end,bool fast)

{
  bool bVar1;
  reference pvVar2;
  rep rVar3;
  void *this;
  unsigned_long *puVar4;
  size_type sVar5;
  ostream *poVar6;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_168;
  duration<unsigned_long,_std::ratio<1L,_1000000000L>_> local_160;
  time_point<hta::Clock,_std::chrono::duration<unsigned_long,_std::ratio<1L,_1000000000L>_>_>
  local_158;
  time_point<hta::Clock,_std::chrono::duration<unsigned_long,_std::ratio<1L,_1000000000L>_>_>
  expected_time;
  size_t index;
  value_type ta;
  ulong local_108;
  size_t sub_index;
  __mbstate_t local_f8;
  unsigned_long local_f0;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_e8;
  size_t chunk_begin;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_d8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_d0;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_c8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_c0;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_b8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_b0;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_a8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_a0;
  fpos<__mbstate_t> local_98;
  ulong local_88;
  size_t issue_count;
  undefined1 local_70 [8];
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> data;
  TimePoint previous_time;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_40;
  TimePoint epoch;
  size_type size;
  bool fast_local;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *file_local;
  TimePoint raw_end_local;
  TimePoint raw_epoch_local;
  Duration interval_local;
  
  raw_epoch_local.
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
       (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
       interval.__r;
  epoch.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
  .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
         File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::size(file);
  local_40.__d.__r =
       (duration)
       interval_begin(raw_epoch,
                      (Duration)
                      raw_epoch_local.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r);
  Clock::time_point::time_point
            ((time_point *)
             &data.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::vector
            ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_70);
  std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::reserve
            ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_70,0x1000);
  local_88 = 0;
  std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::resize
            ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_70,1);
  std::fpos<__mbstate_t>::fpos
            (&local_98,
             (long)epoch.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r + -1);
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
            (file,(int)local_70,(void *)local_98._M_off,(size_t)local_98._M_state);
  pvVar2 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::operator[]
                     ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_70,0)
  ;
  local_a0 = std::chrono::operator+
                       ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)pvVar2,(duration<long,_std::ratio<1L,_1000000000L>_> *)&raw_epoch_local);
  local_b8.__d.__r =
       (duration)
       (duration)
       raw_epoch_local.
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  local_b0.__d.__r =
       (duration)
       (duration)
       raw_end.
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  local_a8.__d.__r =
       (duration)
       interval_begin(raw_end,(Duration)
                              raw_epoch_local.
                              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              .__d.__r);
  bVar1 = std::chrono::operator!=(&local_a0,&local_a8);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error: Invalid last interval timestamp: ");
    pvVar2 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::operator[]
                       ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_70,
                        0);
    local_c0.__d.__r =
         (duration)
         (pvVar2->time).
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    poVar6 = operator<<(poVar6,(TimePoint)local_c0.__d.__r);
    poVar6 = std::operator<<(poVar6,", expected: ");
    local_d8.__d.__r =
         (duration)
         (duration)
         raw_epoch_local.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    local_d0.__d.__r =
         (duration)
         (duration)
         raw_end.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    local_c8.__d.__r =
         (duration)
         interval_begin(raw_end,(Duration)
                                raw_epoch_local.
                                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                .__d.__r);
    poVar6 = operator<<(poVar6,(TimePoint)local_c8.__d.__r);
    poVar6 = std::operator<<(poVar6,", raw_end: ");
    chunk_begin = (size_t)raw_end.
                          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          .__d.__r;
    poVar6 = operator<<(poVar6,raw_end);
    poVar6 = std::operator<<(poVar6,", interval: ");
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&raw_epoch_local);
    this = (void *)std::ostream::operator<<(poVar6,rVar3);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_88 = local_88 + 1;
  }
  local_e8.__d.__r = (duration)0;
  if ((fast) &&
     (0x1000 < (ulong)epoch.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r)) {
    local_e8.__d.__r =
         (duration)
         ((long)epoch.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r - 0x1000);
  }
  for (; (ulong)local_e8.__d.__r <
         (ulong)epoch.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r; local_e8.__d.__r = (duration)((long)local_e8.__d.__r + 0x1000)) {
    local_f0 = (long)epoch.
                     super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     .__d.__r - (long)local_e8.__d.__r;
    puVar4 = std::min<unsigned_long>(&chunk_size,&local_f0);
    std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::resize
              ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_70,*puVar4);
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&sub_index,(streamoff)local_e8.__d.__r);
    File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
              (file,(int)local_70,(void *)sub_index,(size_t)local_f8);
    for (local_108 = 0;
        sVar5 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::size
                          ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)
                           local_70), local_108 < sVar5; local_108 = local_108 + 1) {
      pvVar2 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::operator[]
                         ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)
                          local_70,local_108);
      ta.aggregate.integral = (Value)(pvVar2->aggregate).active_time.__r;
      index = (pvVar2->time).
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r;
      ta.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (pvVar2->aggregate).minimum;
      ta.aggregate.minimum = (pvVar2->aggregate).maximum;
      ta.aggregate.maximum = (pvVar2->aggregate).sum;
      ta.aggregate.sum = (Value)(pvVar2->aggregate).count;
      ta.aggregate.count = (uint64_t)(pvVar2->aggregate).integral;
      expected_time.__d.__r = (duration)((long)local_e8.__d.__r + local_108);
      local_160 = std::chrono::operator*
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)&raw_epoch_local,
                             (unsigned_long *)&expected_time);
      local_158 = std::chrono::operator+(&local_40,&local_160);
      bVar1 = std::chrono::operator!=
                        (&local_158,
                         (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&index);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error: [");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)expected_time.__d.__r);
        poVar6 = std::operator<<(poVar6,"] bogus time, expected: ");
        Clock::time_point::
        time_point<std::chrono::duration<unsigned_long,std::ratio<1l,1000000000l>>,void>
                  ((time_point *)&local_168,&local_158);
        poVar6 = operator<<(poVar6,(TimePoint)local_168.__d.__r);
        poVar6 = std::operator<<(poVar6,", actual: ");
        poVar6 = operator<<(poVar6,(TimePoint)index);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_88 = local_88 + 1;
      }
      bVar1 = std::chrono::operator<
                        ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&index,
                         (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&data.
                             super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error: [");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)expected_time.__d.__r);
        poVar6 = std::operator<<(poVar6,"] non-monotonous time ");
        poVar6 = operator<<(poVar6,(TimePoint)index);
        poVar6 = std::operator<<(poVar6," follows ");
        poVar6 = operator<<(poVar6,(TimePoint)
                                   data.
                                   super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_88 = local_88 + 1;
      }
      else {
        bVar1 = std::chrono::operator==
                          ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&index,
                           (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&data.
                               super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Error: [");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)expected_time.__d.__r);
          poVar6 = std::operator<<(poVar6,"] duplicate time ");
          poVar6 = operator<<(poVar6,(TimePoint)index);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          local_88 = local_88 + 1;
        }
        else {
          data.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)index;
        }
      }
      bVar1 = std::isfinite((double)ta.aggregate.count);
      if ((((!bVar1) || (bVar1 = std::isfinite(ta.aggregate.minimum), !bVar1)) ||
          (bVar1 = std::isfinite((double)ta.time.
                                         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                         .__d.__r), !bVar1)) ||
         (bVar1 = std::isfinite(ta.aggregate.maximum), !bVar1)) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Warning: [");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)expected_time.__d.__r);
        poVar6 = std::operator<<(poVar6,"] non-finite aggregate ");
        poVar6 = operator<<(poVar6,(Aggregate *)&ta);
        poVar6 = std::operator<<(poVar6," at ");
        poVar6 = operator<<(poVar6,(TimePoint)index);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_88 = local_88 + 1;
      }
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Finished check of ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,(ulong)epoch.
                                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    .__d.__r);
  poVar6 = std::operator<<(poVar6," entries: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_88);
  poVar6 = std::operator<<(poVar6," issues.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::~vector
            ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_70);
  return;
}

Assistant:

void check_hta(File<Metric::Header, TimeAggregate>& file, Duration interval, TimePoint raw_epoch,
               TimePoint raw_end, bool fast = false)
{
    auto size = file.size();
    auto epoch = interval_begin(raw_epoch, interval);

    TimePoint previous_time;
    std::vector<TimeAggregate> data;
    data.reserve(chunk_size);

    size_t issue_count = 0;

    // check last chunk consistency
    data.resize(1);
    file.read(data, size - 1);
    if (data[0].time + interval != interval_begin(raw_end, interval))
    {
        std::cerr << "Error: Invalid last interval timestamp: " << data[0].time
                  << ", expected: " << interval_begin(raw_end, interval) << ", raw_end: " << raw_end
                  << ", interval: " << interval.count() << std::endl;
        issue_count++;
    }

    size_t chunk_begin = 0;
    if (fast && size > chunk_size)
    {
        chunk_begin = size - chunk_size;
    }
    for (; chunk_begin < size; chunk_begin += chunk_size)
    {
        data.resize(std::min(chunk_size, size - chunk_begin));
        file.read(data, chunk_begin);
        for (size_t sub_index = 0; sub_index < data.size(); sub_index++)
        {
            auto ta = data[sub_index];
            auto index = chunk_begin + sub_index;

            auto expected_time = epoch + interval * index;
            if (expected_time != ta.time)
            {
                std::cerr << "Error: [" << index << "] bogus time, expected: " << expected_time
                          << ", actual: " << ta.time << std::endl;
                issue_count++;
            }
            if (ta.time < previous_time)
            {
                std::cerr << "Error: [" << index << "] non-monotonous time " << ta.time
                          << " follows " << previous_time << std::endl;
                issue_count++;
            }
            else if (ta.time == previous_time)
            {
                std::cerr << "Error: [" << index << "] duplicate time " << ta.time << std::endl;
                issue_count++;
            }
            else
            {
                previous_time = ta.time;
            }

            if (!std::isfinite(ta.aggregate.integral) || !std::isfinite(ta.aggregate.maximum) ||
                !std::isfinite(ta.aggregate.minimum) || !std::isfinite(ta.aggregate.sum))
            {
                std::cerr << "Warning: [" << index << "] non-finite aggregate " << ta.aggregate
                          << " at " << ta.time << std::endl;
                issue_count++;
            }
        }
    }
    std::cout << "Finished check of " << size << " entries: " << issue_count << " issues."
              << std::endl;
}